

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::GenerateConstinitInitializer
          (MapFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *file;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MapFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  file = FieldDescriptor::file((this->super_FieldGenerator).descriptor_);
  bVar1 = HasDescriptorMethods(file,(this->super_FieldGenerator).options_);
  if (bVar1) {
    Formatter::operator()<>
              ((Formatter *)local_50,"$name$_(::$proto_ns$::internal::ConstantInitialized{})");
  }
  else {
    Formatter::operator()<>((Formatter *)local_50,"$name$_()");
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void MapFieldGenerator::GenerateConstinitInitializer(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format("$name$_(::$proto_ns$::internal::ConstantInitialized{})");
  } else {
    format("$name$_()");
  }
}